

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall mjs::object_literal_expression::print(object_literal_expression *this,wostream *os)

{
  property_assignment_type t;
  long *plVar1;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  wostream *pwVar3;
  long lVar4;
  ulong uVar5;
  
  std::operator<<(os,"object_literal_expression{");
  if ((this->elements_).
      super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->elements_).
      super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      if (uVar5 != 0) {
        std::operator<<(os,", ");
      }
      t = *(property_assignment_type *)
           ((long)&((this->elements_).
                    super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                    ._M_impl.super__Vector_impl_data._M_start)->type_ + lVar4);
      if (t != normal) {
        pbVar2 = mjs::operator<<(os,t);
        std::operator<<(pbVar2," ");
      }
      plVar1 = *(long **)((long)&(((this->elements_).
                                   super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name_)._M_t.
                                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                         + lVar4);
      (**(code **)(*plVar1 + 0x10))(plVar1,os);
      pwVar3 = std::operator<<(os,": ");
      plVar1 = *(long **)((long)&(((this->elements_).
                                   super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->value_)._M_t.
                                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                         + lVar4);
      (**(code **)(*plVar1 + 0x10))(plVar1,pwVar3);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 < (ulong)(((long)(this->elements_).
                                    super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->elements_).
                                    super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "object_literal_expression{";
        for (size_t i = 0; i < elements_.size(); ++i) {
            if (i) os << ", ";
            if (elements_[i].type() != property_assignment_type::normal) os << elements_[i].type() << " ";
            os << elements_[i].name() << ": " << elements_[i].value();
        }
        os << "}";
    }